

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

bool tcu::anon_unknown_3::pixelNearLineSegment(IVec2 *pixel,Vec2 *p0,Vec2 *p1)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Type TVar7;
  Vector<float,_2> local_68;
  Vector<float,_2> local_60;
  Vector<float,_2> local_58;
  float local_50;
  float local_4c;
  float maxDistance;
  float crossProduct;
  Vec2 v;
  Vec2 line;
  float maxPixelDistanceSquared;
  float maxPixelDistance;
  Vec2 pixelCenterPosition;
  Vec2 *p1_local;
  Vec2 *p0_local;
  IVec2 *pixel_local;
  
  pixelCenterPosition.m_data = (float  [2])p1;
  iVar1 = Vector<int,_2>::x(pixel);
  iVar2 = Vector<int,_2>::y(pixel);
  Vector<float,_2>::Vector
            ((Vector<float,_2> *)&maxPixelDistanceSquared,(float)iVar1 + 0.5,(float)iVar2 + 0.5);
  tcu::operator-((tcu *)&v,(Vector<float,_2> *)pixelCenterPosition.m_data,p0);
  tcu::operator-((tcu *)&maxDistance,(Vector<float,_2> *)&maxPixelDistanceSquared,p0);
  fVar3 = Vector<float,_2>::x(&v);
  fVar4 = Vector<float,_2>::y((Vector<float,_2> *)&maxDistance);
  fVar5 = Vector<float,_2>::y(&v);
  fVar6 = Vector<float,_2>::x((Vector<float,_2> *)&maxDistance);
  local_4c = fVar3 * fVar4 + -(fVar5 * fVar6);
  fVar3 = local_4c * local_4c;
  fVar4 = lengthSquared<float,2>(&v);
  if (fVar3 <= fVar4 * 2.0) {
    tcu::operator-((tcu *)&local_58,(Vector<float,_2> *)pixelCenterPosition.m_data,p0);
    TVar7 = length<float,2>(&local_58);
    local_50 = TVar7 + 1.414;
    tcu::operator-((tcu *)&local_60,(Vector<float,_2> *)&maxPixelDistanceSquared,p0);
    TVar7 = length<float,2>(&local_60);
    if (TVar7 <= local_50) {
      tcu::operator-((tcu *)&local_68,(Vector<float,_2> *)&maxPixelDistanceSquared,
                     (Vector<float,_2> *)pixelCenterPosition.m_data);
      TVar7 = length<float,2>(&local_68);
      if (TVar7 <= local_50) {
        pixel_local._7_1_ = true;
      }
      else {
        pixel_local._7_1_ = false;
      }
    }
    else {
      pixel_local._7_1_ = false;
    }
  }
  else {
    pixel_local._7_1_ = false;
  }
  return pixel_local._7_1_;
}

Assistant:

bool pixelNearLineSegment (const tcu::IVec2& pixel, const tcu::Vec2& p0, const tcu::Vec2& p1)
{
	const tcu::Vec2 pixelCenterPosition = tcu::Vec2((float)pixel.x() + 0.5f, (float)pixel.y() + 0.5f);

	// "Near" = Distance from the line to the pixel is less than 2 * pixel_max_radius. (pixel_max_radius = sqrt(2) / 2)
	const float maxPixelDistance		= 1.414f;
	const float maxPixelDistanceSquared	= 2.0f;

	// Near the line
	{
		const tcu::Vec2	line			= p1                  - p0;
		const tcu::Vec2	v				= pixelCenterPosition - p0;
		const float		crossProduct	= (line.x() * v.y() - line.y() * v.x());

		// distance to line: (line x v) / |line|
		//     |(line x v) / |line|| > maxPixelDistance
		// ==> (line x v)^2 / |line|^2 > maxPixelDistance^2
		// ==> (line x v)^2 > maxPixelDistance^2 * |line|^2

		if (crossProduct * crossProduct > maxPixelDistanceSquared * tcu::lengthSquared(line))
			return false;
	}

	// Between the endpoints
	{
		// distance from line endpoint 1 to pixel is less than line length + maxPixelDistance
		const float maxDistance = tcu::length(p1 - p0) + maxPixelDistance;

		if (tcu::length(pixelCenterPosition - p0) > maxDistance)
			return false;
		if (tcu::length(pixelCenterPosition - p1) > maxDistance)
			return false;
	}

	return true;
}